

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

ON_ModelComponentReference __thiscall
ONX_Model::Internal_AddModelComponent
          (ONX_Model *this,ON_ModelComponent *model_component,ON_UUID id,ON_UUID name_parent_id,
          ON_wString *name,bool bManagedComponent,bool bUpdateComponentIdentification)

{
  long *plVar1;
  undefined8 uVar2;
  ON_UUID manifest_id;
  bool bVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  char cVar6;
  bool bVar7;
  Type TVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int component_index;
  int iVar13;
  ON_UUID *pOVar14;
  ON_Bitmap *this_00;
  ON_FileReference *file_reference;
  ON_NameHash *pOVar15;
  ON__UINT64 component_serial_number;
  ON_ComponentManifestItem *this_01;
  wchar_t *component_name;
  ON_ModelGeometryComponent *pOVar16;
  ON_Object *p;
  ON_Light *pOVar17;
  ON_3dmObjectAttributes *pOVar18;
  char *sFormat;
  ON_ModelComponent *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  uchar name_00 [8];
  ON_ModelComponentReference OVar20;
  char in_stack_00000020;
  ON_NameHash original_name_hash;
  ON_NameHash name_hash;
  ON_UUID original_id;
  ON_ManifestMapItem manifest_to_original;
  ON_ManifestMapItem original_to_manifest;
  uchar local_130 [8];
  uchar auStack_128 [8];
  undefined1 local_120 [16];
  ON__UINT64 OStack_110;
  uchar local_108 [8];
  undefined1 auStack_100 [16];
  ON_UUID *local_f0;
  ON_ModelComponentReference local_e8;
  uchar local_d8 [8];
  ON__UINT64 OStack_d0;
  uchar local_c8 [8];
  undefined1 auStack_c0 [24];
  ON_UUID_struct local_a8;
  ON_ManifestMapItem local_90;
  ON_ManifestMapItem local_60;
  
  local_130 = id.Data4;
  this_02 = id._0_8_;
  name_00 = name_parent_id.Data4;
  auStack_128 = name_parent_id._0_8_;
  if (this_02 == (ON_ModelComponent *)0x0) {
    sFormat = "Invalid model_component parameter.";
    iVar12 = 0x6ec;
  }
  else {
    bVar7 = ON_ModelComponent::IsSystemComponent(this_02);
    if (bVar7) {
      sFormat = "Invalid model_component parameter.";
      iVar12 = 0x6f2;
    }
    else {
      TVar8 = ON_ModelComponent::ComponentType(this_02);
      bVar7 = ON_ModelComponent::ComponentTypeIsValidAndNotMixed(TVar8);
      if (bVar7) {
        iVar12 = ON_ModelComponent::Index(this_02);
        pOVar14 = ON_ModelComponent::Id(this_02);
        local_a8.Data1 = pOVar14->Data1;
        local_a8.Data2 = pOVar14->Data2;
        local_a8.Data3 = pOVar14->Data3;
        local_a8.Data4 = *&pOVar14->Data4;
        if (TVar8 == Image) {
          this_00 = ON_Bitmap::Cast(&this_02->super_ON_Object);
          if (this_00 == (ON_Bitmap *)0x0) {
            auStack_100[8] = ON_NameHash::UnsetNameHash.m_parent_id.Data4[0];
            auStack_100[9] = ON_NameHash::UnsetNameHash.m_parent_id.Data4[1];
            auStack_100[10] = ON_NameHash::UnsetNameHash.m_parent_id.Data4[2];
            auStack_100[0xb] = ON_NameHash::UnsetNameHash.m_parent_id.Data4[3];
            auStack_100[0xc] = ON_NameHash::UnsetNameHash.m_parent_id.Data4[4];
            auStack_100[0xd] = ON_NameHash::UnsetNameHash.m_parent_id.Data4[5];
            auStack_100[0xe] = ON_NameHash::UnsetNameHash.m_parent_id.Data4[6];
            auStack_100[0xf] = ON_NameHash::UnsetNameHash.m_parent_id.Data4[7];
            local_108[0] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[0xc];
            local_108[1] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[0xd];
            local_108[2] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[0xe];
            local_108[3] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[0xf];
            local_108[4] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[0x10];
            local_108[5] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[0x11];
            local_108[6] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[0x12];
            local_108[7] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[0x13];
            auStack_100._0_4_ = ON_NameHash::UnsetNameHash.m_parent_id.Data1;
            auStack_100._4_2_ = ON_NameHash::UnsetNameHash.m_parent_id.Data2;
            auStack_100._6_2_ = ON_NameHash::UnsetNameHash.m_parent_id.Data3;
            local_120._8_4_ = ON_NameHash::UnsetNameHash.m_flags;
            local_120[0xc] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[0];
            local_120[0xd] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[1];
            local_120[0xe] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[2];
            local_120[0xf] = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[3];
            OStack_110._0_1_ = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[4];
            OStack_110._1_1_ = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[5];
            OStack_110._2_1_ = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[6];
            OStack_110._3_1_ = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[7];
            OStack_110._4_1_ = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[8];
            OStack_110._5_1_ = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[9];
            OStack_110._6_1_ = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[10];
            OStack_110._7_1_ = ON_NameHash::UnsetNameHash.m_sha1_hash.m_digest[0xb];
          }
          else {
            file_reference = ON_Bitmap::FileReference(this_00);
            ON_NameHash::CreateFilePathHash((ON_NameHash *)(local_120 + 8),file_reference);
          }
          auStack_c0._8_8_ = auStack_100._8_8_;
          local_c8[0] = local_108[0];
          local_c8[1] = local_108[1];
          local_c8[2] = local_108[2];
          local_c8[3] = local_108[3];
          local_c8[4] = local_108[4];
          local_c8[5] = local_108[5];
          local_c8[6] = local_108[6];
          local_c8[7] = local_108[7];
          auStack_c0._0_8_ = auStack_100._0_8_;
          local_d8[0] = local_120[8];
          local_d8[1] = local_120[9];
          local_d8[2] = local_120[10];
          local_d8[3] = local_120[0xb];
          local_d8[4] = local_120[0xc];
          local_d8[5] = local_120[0xd];
          local_d8[6] = local_120[0xe];
          local_d8[7] = local_120[0xf];
          OStack_d0 = OStack_110;
        }
        else {
          pOVar15 = ON_ModelComponent::NameHash(this_02);
          local_120._8_8_ = *(undefined8 *)pOVar15;
          OStack_110 = *(ON__UINT64 *)((pOVar15->m_sha1_hash).m_digest + 4);
          local_108 = *(uchar (*) [8])((pOVar15->m_sha1_hash).m_digest + 0xc);
          auStack_100._0_8_ = *(undefined8 *)&pOVar15->m_parent_id;
          auStack_100._8_8_ = *(undefined8 *)(pOVar15->m_parent_id).Data4;
          bVar7 = ON_ModelComponent::UniqueNameIgnoresCase(TVar8);
          ON_NameHash::Create((ON_NameHash *)local_d8,(ON_UUID *)&name,(ON_wString *)name_00,bVar7);
        }
        cVar6 = in_stack_00000020;
        bVar7 = ON_ModelComponent::IndexRequired(TVar8);
        component_index = -0x7fffffff;
        if ((bVar7) &&
           (component_index =
                 ON_ComponentManifest::ComponentIndexLimit
                           ((ON_ComponentManifest *)&model_component[0xf].m_component_name_hash,
                            TVar8), cVar6 == '\x01' && component_index == 0x7fffffff)) {
          sFormat = "Unable to set model_component_index.";
          iVar12 = 0x716;
        }
        else if (cVar6 == '\0') {
          bVar10 = false;
          bVar3 = false;
          bVar9 = false;
LAB_004845aa:
          plVar1 = (long *)(*(long *)model_component[0xf].m_component_parent_id.Data4 + 8);
          *plVar1 = *plVar1 + 1;
          TVar8 = ON_ModelComponent::ComponentType(this_02);
          component_serial_number = ON_ModelComponent::RuntimeSerialNumber(this_02);
          manifest_id.Data4[0] = auStack_128[0];
          manifest_id.Data4[1] = auStack_128[1];
          manifest_id.Data4[2] = auStack_128[2];
          manifest_id.Data4[3] = auStack_128[3];
          manifest_id.Data4[4] = auStack_128[4];
          manifest_id.Data4[5] = auStack_128[5];
          manifest_id.Data4[6] = auStack_128[6];
          manifest_id.Data4[7] = auStack_128[7];
          manifest_id._0_8_ = local_130;
          this_01 = ON_ComponentManifest::AddComponentToManifest
                              ((ON_ComponentManifest *)&model_component[0xf].m_component_name_hash,
                               TVar8,component_serial_number,manifest_id,(ON_NameHash *)local_d8);
          bVar11 = ON_ComponentManifestItem::IsUnset(this_01);
          if (!bVar11) {
            local_60.m_component_type = Unset;
            local_60.m_reserved = 0;
            local_60.m_source_index = -0x7fffffff;
            local_60.m_destination_index = -0x7fffffff;
            local_60.m_source_id.Data1 = 0;
            local_60.m_source_id.Data2 = 0;
            local_60.m_source_id.Data3 = 0;
            local_60.m_source_id.Data4[0] = '\0';
            local_60.m_source_id.Data4[1] = '\0';
            local_60.m_source_id.Data4[2] = '\0';
            local_60.m_source_id.Data4[3] = '\0';
            local_60.m_source_id.Data4[4] = '\0';
            local_60.m_source_id.Data4[5] = '\0';
            local_60.m_source_id.Data4[6] = '\0';
            local_60.m_source_id.Data4[7] = '\0';
            local_60.m_destination_id.Data1 = 0;
            local_60.m_destination_id.Data2 = 0;
            local_60.m_destination_id.Data3 = 0;
            local_60.m_destination_id.Data4[0] = '\0';
            local_60.m_destination_id.Data4[1] = '\0';
            local_60.m_destination_id.Data4[2] = '\0';
            local_60.m_destination_id.Data4[3] = '\0';
            local_60.m_destination_id.Data4[4] = '\0';
            local_60.m_destination_id.Data4[5] = '\0';
            local_60.m_destination_id.Data4[6] = '\0';
            local_60.m_destination_id.Data4[7] = '\0';
            bVar11 = ON_ManifestMapItem::SetSourceIdentification(&local_60,this_02);
            if ((bVar11) &&
               (bVar11 = ON_ManifestMapItem::SetDestinationIdentification(&local_60,this_01), bVar11
               )) {
              ON_ManifestMap::AddMapItem
                        ((ON_ManifestMap *)
                         (model_component[0xf].m_component_name_hash.m_sha1_hash.m_digest + 4),
                         &local_60);
            }
            local_90.m_component_type = Unset;
            local_90.m_reserved = 0;
            local_90.m_source_index = -0x7fffffff;
            local_90.m_destination_index = -0x7fffffff;
            local_90.m_source_id.Data1 = 0;
            local_90.m_source_id.Data2 = 0;
            local_90.m_source_id.Data3 = 0;
            local_90.m_source_id.Data4[0] = '\0';
            local_90.m_source_id.Data4[1] = '\0';
            local_90.m_source_id.Data4[2] = '\0';
            local_90.m_source_id.Data4[3] = '\0';
            local_90.m_source_id.Data4[4] = '\0';
            local_90.m_source_id.Data4[5] = '\0';
            local_90.m_source_id.Data4[6] = '\0';
            local_90.m_source_id.Data4[7] = '\0';
            local_90.m_destination_id.Data1 = 0;
            local_90.m_destination_id.Data2 = 0;
            local_90.m_destination_id.Data3 = 0;
            local_90.m_destination_id.Data4[0] = '\0';
            local_90.m_destination_id.Data4[1] = '\0';
            local_90.m_destination_id.Data4[2] = '\0';
            local_90.m_destination_id.Data4[3] = '\0';
            local_90.m_destination_id.Data4[4] = '\0';
            local_90.m_destination_id.Data4[5] = '\0';
            local_90.m_destination_id.Data4[6] = '\0';
            local_90.m_destination_id.Data4[7] = '\0';
            bVar11 = ON_ManifestMapItem::SetSourceIdentification(&local_90,this_01);
            if ((bVar11) &&
               (bVar11 = ON_ManifestMapItem::SetDestinationIdentification(&local_90,this_02), bVar11
               )) {
              ON_ManifestMap::AddMapItem
                        ((ON_ManifestMap *)
                         (model_component[0xf].m_component_name_hash.m_sha1_hash.m_digest + 0xc),
                         &local_90);
            }
            iVar12 = ON_ModelComponent::Index(this_02);
            if (bVar7) {
              iVar13 = ON_ComponentManifestItem::Index(this_01);
              if ((iVar12 != iVar13) &&
                 (ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                             ,0x775,"","Unexpected manifest_item_index value."), bVar3)) {
                bVar7 = ON_ModelComponent::SetIndex(this_02,component_index);
                iVar12 = 0x778;
                if (!bVar7) {
LAB_00484ad4:
                  sFormat = "model_component->SetIndex(...) failed.";
                  goto LAB_0048442e;
                }
              }
            }
            else {
              if ((iVar12 != -0x7fffffff) &&
                 (ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                             ,0x781,"","Unexpected model_component->Index() value."), bVar3)) {
                bVar7 = ON_ModelComponent::SetIndex(this_02,-0x7fffffff);
                iVar12 = 0x784;
                if (!bVar7) goto LAB_00484ad4;
              }
              iVar12 = ON_ComponentManifestItem::Index(this_01);
              if (iVar12 != -0x7fffffff) {
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                           ,0x78a,"","Unexpected manifest_item_index value.");
              }
            }
            TVar8 = ON_ModelComponent::ComponentType(this_02);
            if (((TVar8 == ModelGeometry) &&
                (pOVar16 = ON_ModelGeometryComponent::Cast(&this_02->super_ON_Object),
                pOVar16 != (ON_ModelGeometryComponent *)0x0)) &&
               (pOVar18 = ON_ModelGeometryComponent::Attributes
                                    (pOVar16,(ON_3dmObjectAttributes *)0x0),
               pOVar18 != (ON_3dmObjectAttributes *)0x0)) {
              if (bVar9) {
                pOVar14 = ON_ModelComponent::Id(&pOVar16->super_ON_ModelComponent);
                uVar4 = pOVar14->Data2;
                uVar5 = pOVar14->Data3;
                uVar2 = *(undefined8 *)pOVar14->Data4;
                (pOVar18->m_uuid).Data1 = pOVar14->Data1;
                (pOVar18->m_uuid).Data2 = uVar4;
                (pOVar18->m_uuid).Data3 = uVar5;
                *(undefined8 *)(pOVar18->m_uuid).Data4 = uVar2;
              }
              if (bVar10 != false) {
                ON_ModelComponent::Name((ON_ModelComponent *)local_120);
                ON_wString::operator=(&pOVar18->m_name,(ON_wString *)local_120);
                ON_wString::~ON_wString((ON_wString *)local_120);
              }
            }
            bVar7 = bUpdateComponentIdentification;
            if (in_stack_00000020 != '\0') {
              (*(this_02->super_ON_Object)._vptr_ON_Object[0xe])
                        (this_02,&ON_ComponentManifest::Empty,
                         &model_component[0xf].m_component_name_hash,
                         model_component[0xf].m_component_name_hash.m_sha1_hash.m_digest + 4);
            }
            ON_ModelComponentReference::CreateForExperts
                      ((ON_ModelComponentReference *)this,this_02,bVar7);
            ON_ModelComponentReference::ON_ModelComponentReference
                      (&local_e8,(ON_ModelComponentReference *)this);
            Internal_AddModelComponentReference((ONX_Model *)model_component,&local_e8);
            ON_ModelComponentReference::~ON_ModelComponentReference(&local_e8);
            _Var19._M_pi = extraout_RDX_00;
            goto LAB_00484444;
          }
          sFormat = "Unable to update model manifest.";
          iVar12 = 0x761;
        }
        else {
          bVar9 = ::operator==(&local_a8,(ON_UUID_struct *)local_130);
          if (TVar8 == Image) {
            bVar10 = false;
            bVar3 = false;
            if (iVar12 != component_index && bVar7) {
LAB_00484774:
              bVar11 = ON_ModelComponent::IndexIsLocked(this_02);
              bVar3 = true;
              if (bVar11) {
                sFormat = "Unable to set component index.";
                iVar12 = 0x720;
                goto LAB_0048442e;
              }
            }
          }
          else {
            bVar10 = ::operator!=((ON_NameHash *)(local_120 + 8),(ON_NameHash *)local_d8);
            if (iVar12 != component_index && bVar7) goto LAB_00484774;
            bVar3 = false;
          }
          if ((bVar9) || (bVar11 = ON_ModelComponent::IdIsLocked(this_02), !bVar11)) {
            if ((bVar10 == false) || (bVar11 = ON_ModelComponent::NameIsLocked(this_02), !bVar11)) {
              if ((!bVar3) ||
                 (bVar11 = ON_ModelComponent::SetIndex(this_02,component_index), bVar11)) {
                if ((bVar9) ||
                   (bVar11 = ON_ModelComponent::SetId(this_02,(ON_UUID *)local_130), bVar11)) {
                  if (bVar10 != false) {
                    component_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)name_00);
                    bVar11 = ON_ModelComponent::SetName(this_02,component_name);
                    if (!bVar11) {
                      sFormat = "model_component->SetName(...) failed.";
                      iVar12 = 0x73a;
                      goto LAB_0048442e;
                    }
                  }
                  bVar9 = !bVar9;
                  pOVar16 = ON_ModelGeometryComponent::Cast(&this_02->super_ON_Object);
                  if (pOVar16 != (ON_ModelGeometryComponent *)0x0) {
                    p = &ON_ModelGeometryComponent::Geometry(pOVar16,(ON_Geometry *)0x0)->
                         super_ON_Object;
                    pOVar17 = ON_Light::Cast(p);
                    if (pOVar17 != (ON_Light *)0x0) {
                      local_f0 = &pOVar17->m_light_id;
                      bVar11 = ::operator!=((ON_UUID_struct *)local_130,local_f0);
                      if (bVar11) {
                        *(uchar (*) [8])local_f0 = local_130;
                        *&local_f0->Data4 = auStack_128;
                      }
                      bVar11 = ::operator!=((ON_wString *)name_00,&pOVar17->m_light_name);
                      if (bVar11) {
                        ON_wString::operator=(&pOVar17->m_light_name,(ON_wString *)name_00);
                      }
                    }
                    pOVar18 = ON_ModelGeometryComponent::Attributes
                                        (pOVar16,(ON_3dmObjectAttributes *)0x0);
                    if (pOVar18 != (ON_3dmObjectAttributes *)0x0) {
                      bVar11 = ::operator!=((ON_UUID_struct *)local_130,&pOVar18->m_uuid);
                      if (bVar11) {
                        *(uchar (*) [8])&pOVar18->m_uuid = local_130;
                        *&(pOVar18->m_uuid).Data4 = auStack_128;
                      }
                      bVar11 = ::operator!=((ON_wString *)name_00,&pOVar18->m_name);
                      if (bVar11) {
                        ON_wString::operator=(&pOVar18->m_name,(ON_wString *)name_00);
                      }
                    }
                  }
                  goto LAB_004845aa;
                }
                sFormat = "model_component->SetId(...) failed.";
                iVar12 = 0x735;
              }
              else {
                sFormat = "model_component->SetIndex(...) failed.";
                iVar12 = 0x730;
              }
            }
            else {
              sFormat = "Unable to set component name.";
              iVar12 = 0x72a;
            }
          }
          else {
            sFormat = "Unable to set component id.";
            iVar12 = 0x725;
          }
        }
      }
      else {
        sFormat = "Invalid model_component parameter.";
        iVar12 = 0x6f9;
      }
    }
  }
LAB_0048442e:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
             ,iVar12,"",sFormat);
  ON_ModelComponentReference::ON_ModelComponentReference
            ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
  _Var19._M_pi = extraout_RDX;
LAB_00484444:
  OVar20.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var19._M_pi;
  OVar20.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar20.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::Internal_AddModelComponent(
  ON_ModelComponent* model_component,
  ON_UUID id,
  ON_UUID name_parent_id,
  const ON_wString& name,
  bool bManagedComponent,
  bool bUpdateComponentIdentification
  )
{
  for (;;)
  {
    if (nullptr == model_component)
    {
      ON_ERROR("Invalid model_component parameter.");
      break;
    }

    if (model_component->IsSystemComponent())
    {
      ON_ERROR("Invalid model_component parameter.");
      break;
    }
    
    const ON_ModelComponent::Type component_type = model_component->ComponentType();
    if (!ON_ModelComponent::ComponentTypeIsValidAndNotMixed(component_type))
    {
      ON_ERROR("Invalid model_component parameter.");
      break;
    }

    const int original_index = model_component->Index();
    const ON_UUID original_id = model_component->Id();
    const bool bIsEmbeddedFileReference = (ON_ModelComponent::Type::Image == component_type);
    const ON_Bitmap* embedded_file
      = bIsEmbeddedFileReference
      ? ON_Bitmap::Cast(model_component)
      : nullptr;

    const ON_NameHash original_name_hash 
      = bIsEmbeddedFileReference
      ? (nullptr == embedded_file ? ON_NameHash::UnsetNameHash : ON_NameHash::CreateFilePathHash(embedded_file->FileReference()) )
      : model_component->NameHash();

    const ON_NameHash name_hash 
      = bIsEmbeddedFileReference
      ? original_name_hash
      : ON_NameHash::Create(name_parent_id,name,ON_ModelComponent::UniqueNameIgnoresCase(component_type));

    int manifest_item_index = ON_UNSET_INT_INDEX;
    const bool bIndexRequired = ON_ModelComponent::IndexRequired(component_type);
    if (bIndexRequired)
    {
      manifest_item_index = m_manifest.ComponentIndexLimit(component_type);
      if (manifest_item_index >= 0x7FFFFFFF && bUpdateComponentIdentification)
      {
        ON_ERROR("Unable to set model_component_index.");
        break;
      }
    }
    const bool bUpdateIndex = (bUpdateComponentIdentification && bIndexRequired && original_index != (int)manifest_item_index);
    const bool bUpdateId = (bUpdateComponentIdentification && !(original_id == id));
    const bool bUpdateName = (false == bIsEmbeddedFileReference && bUpdateComponentIdentification && original_name_hash != name_hash);

    if (bUpdateIndex && model_component->IndexIsLocked())
    {
      ON_ERROR("Unable to set component index.");
      break;
    }
    if (bUpdateId && model_component->IdIsLocked())
    {
      ON_ERROR("Unable to set component id.");
      break;
    }
    if (bUpdateName && model_component->NameIsLocked())
    {
      ON_ERROR("Unable to set component name.");
      break;
    }

    if (bUpdateIndex && false == model_component->SetIndex((int)manifest_item_index))
    {
      ON_ERROR("model_component->SetIndex(...) failed.");
      break;
    }
    if(bUpdateId && false == model_component->SetId(id) )
    {
      ON_ERROR("model_component->SetId(...) failed.");
      break;
    }
    if(bUpdateName && false == model_component->SetName(name) )
    {
      ON_ERROR("model_component->SetName(...) failed.");
      break;
    }

    if (bUpdateComponentIdentification)
    {
      ON_ModelGeometryComponent* geometry_component = ON_ModelGeometryComponent::Cast(model_component);
      if (nullptr != geometry_component)
      {
        const ON_Light* light = ON_Light::Cast(geometry_component->Geometry(nullptr));
        if (nullptr != light)
        {
          if (id != light->m_light_id)
            const_cast<ON_Light*>(light)->m_light_id = id;
          if (name != light->m_light_name)
            const_cast<ON_Light*>(light)->m_light_name = name;
        }
        const ON_3dmObjectAttributes* attributes = geometry_component->Attributes(nullptr);
        if (nullptr != attributes)
        {
          if (id != attributes->m_uuid)
            const_cast<ON_3dmObjectAttributes*>(attributes)->m_uuid = id;
          if (name != attributes->m_name)
            const_cast<ON_3dmObjectAttributes*>(attributes)->m_name = name;
        }
      }
    }

    Internal_IncrementModelContentVersionNumber();

    const class ON_ComponentManifestItem& manifest_item = m_manifest.AddComponentToManifest(
      model_component->ComponentType(),
      model_component->RuntimeSerialNumber(),
      id,
      name_hash
      );
    
    if (manifest_item.IsUnset())
    {
      ON_ERROR("Unable to update model manifest.");
      break;
    }

    ON_ManifestMapItem original_to_manifest;
    if ( original_to_manifest.SetSourceIdentification(model_component) && original_to_manifest.SetDestinationIdentification(&manifest_item))
    {
      m_original_to_manifest_map.AddMapItem(original_to_manifest);
    }

    ON_ManifestMapItem manifest_to_original;
    if ( manifest_to_original.SetSourceIdentification(&manifest_item) && manifest_to_original.SetDestinationIdentification(model_component) )
    {
      m_manifest_to_original_map.AddMapItem(manifest_to_original);
    }

    if (bIndexRequired)
    {
      if (model_component->Index() != manifest_item.Index())
      {
        ON_ERROR("Unexpected manifest_item_index value.");
        if (bUpdateIndex && false == model_component->SetIndex((int)(manifest_item_index)))
        {
          ON_ERROR("model_component->SetIndex(...) failed.");
          break;
        }
      }
    }
    else
    {
      if (ON_ComponentManifest::UnsetComponentIndex != model_component->Index() )
      {
        ON_ERROR("Unexpected model_component->Index() value.");
        if (bUpdateIndex && false == model_component->SetIndex(ON_ComponentManifest::UnsetComponentIndex))
        {
          ON_ERROR("model_component->SetIndex(...) failed.");
          break;
        }
      }
      if ( ON_UNSET_INT_INDEX != manifest_item.Index() )
      {
        ON_ERROR("Unexpected manifest_item_index value.");
      }
    }

    if (ON_ModelComponent::Type::ModelGeometry == model_component->ComponentType())
    {
      ON_ModelGeometryComponent* model_geometry = ON_ModelGeometryComponent::Cast(model_component);
      if (nullptr != model_geometry)
      {
        // TEMPORARY - until the id and name can be removed from ON_3dmObjectAttributes,
        // they need to be synchronized with the ones on ON_ModelGeometryComponent.
        ON_3dmObjectAttributes* attributes = const_cast< ON_3dmObjectAttributes* >(model_geometry->Attributes(nullptr));
        if (nullptr != attributes)
        {
          if ( bUpdateId )
            attributes->m_uuid = model_geometry->Id();
          if (bUpdateName)
            attributes->m_name = model_geometry->Name();
        }
      }
    }
    
    if (bUpdateComponentIdentification)
    {
      // continue even when UpdateReferencedComponents() returns false
      model_component->UpdateReferencedComponents(ON_ComponentManifest::Empty,m_manifest,m_original_to_manifest_map);
    }

    ON_ModelComponentReference model_component_reference = ON_ModelComponentReference::CreateForExperts(model_component,bManagedComponent);
    Internal_AddModelComponentReference(model_component_reference);
    return model_component_reference;
  }

  return ON_ModelComponentReference::Empty;
}